

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

StringSliceWTF * __thiscall
wasm::Builder::makeStringSliceWTF(Builder *this,Expression *ref,Expression *start,Expression *end)

{
  StringSliceWTF *this_00;
  
  this_00 = (StringSliceWTF *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)89>).super_Expression._id =
       StringSliceWTFId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)89>).super_Expression.type.id = 0;
  this_00->ref = ref;
  this_00->start = start;
  this_00->end = end;
  StringSliceWTF::finalize(this_00);
  return this_00;
}

Assistant:

StringSliceWTF*
  makeStringSliceWTF(Expression* ref, Expression* start, Expression* end) {
    auto* ret = wasm.allocator.alloc<StringSliceWTF>();
    ret->ref = ref;
    ret->start = start;
    ret->end = end;
    ret->finalize();
    return ret;
  }